

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorUtils.H
# Opt level: O1

void __thiscall
pele::physics::reactions::utils::FlattenOps<pele::physics::reactions::utils::YCOrder>::unflatten
          (FlattenOps<pele::physics::reactions::utils::YCOrder> *this,Box *box,int ncells,
          int reactor_type,bool clean_init_massfrac,Array4<double> *rhoY,Array4<double> *temperature
          ,Array4<double> *rhoE,Array4<double> *frcEExt,Array4<double> *FC_in,Real *y_vect,
          Real *vect_energy,long *FCunt,Real dt)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  anon_class_392_14_5e52f3aa local_190;
  
  local_190.lo.x = (box->smallend).vect[0];
  local_190.lo.y = (box->smallend).vect[1];
  local_190.len.x = ((box->bigend).vect[0] - (box->smallend).vect[0]) + 1;
  local_190.len.y = ((box->bigend).vect[1] - (box->smallend).vect[1]) + 1;
  local_190.lo.z = (box->smallend).vect[2];
  local_190.len.z = ((box->bigend).vect[2] - local_190.lo.z) + 1;
  local_190.rhoY.p = rhoY->p;
  local_190.rhoY.jstride = rhoY->jstride;
  local_190.rhoY.kstride = rhoY->kstride;
  local_190.rhoY.nstride = rhoY->nstride;
  local_190.rhoY.begin.x = (rhoY->begin).x;
  local_190.rhoY.begin.y = (rhoY->begin).y;
  uVar1 = *(undefined8 *)&(rhoY->begin).z;
  uVar2 = (rhoY->end).y;
  local_190.rhoY._52_8_ = *(undefined8 *)&(rhoY->end).z;
  local_190.rhoY.begin.z = (int)uVar1;
  local_190.rhoY.end.x = (int)((ulong)uVar1 >> 0x20);
  local_190.temperature.p = temperature->p;
  local_190.temperature.jstride = temperature->jstride;
  local_190.temperature.kstride = temperature->kstride;
  local_190.temperature.nstride = temperature->nstride;
  local_190.temperature.begin.x = (temperature->begin).x;
  local_190.temperature.begin.y = (temperature->begin).y;
  uVar1 = *(undefined8 *)&(temperature->begin).z;
  uVar3 = (temperature->end).y;
  local_190.temperature._52_8_ = *(undefined8 *)&(temperature->end).z;
  local_190.temperature.begin.z = (int)uVar1;
  local_190.temperature.end.x = (int)((ulong)uVar1 >> 0x20);
  local_190.rhoE.p = rhoE->p;
  local_190.rhoE.jstride = rhoE->jstride;
  local_190.rhoE.kstride = rhoE->kstride;
  local_190.rhoE.nstride = rhoE->nstride;
  local_190.rhoE.begin.x = (rhoE->begin).x;
  local_190.rhoE.begin.y = (rhoE->begin).y;
  uVar1 = *(undefined8 *)&(rhoE->begin).z;
  uVar4 = (rhoE->end).y;
  local_190.rhoE._52_8_ = *(undefined8 *)&(rhoE->end).z;
  local_190.rhoE.begin.z = (int)uVar1;
  local_190.rhoE.end.x = (int)((ulong)uVar1 >> 0x20);
  local_190.frcEExt.p = frcEExt->p;
  local_190.frcEExt.jstride = frcEExt->jstride;
  local_190.frcEExt.kstride = frcEExt->kstride;
  local_190.frcEExt.nstride = frcEExt->nstride;
  local_190.frcEExt.begin.x = (frcEExt->begin).x;
  local_190.frcEExt.begin.y = (frcEExt->begin).y;
  uVar1 = *(undefined8 *)&(frcEExt->begin).z;
  uVar5 = (frcEExt->end).y;
  local_190.frcEExt._52_8_ = *(undefined8 *)&(frcEExt->end).z;
  local_190.frcEExt.begin.z = (int)uVar1;
  local_190.frcEExt.end.x = (int)((ulong)uVar1 >> 0x20);
  local_190.FC_in.p = FC_in->p;
  local_190.FC_in.jstride = FC_in->jstride;
  local_190.FC_in.kstride = FC_in->kstride;
  local_190.FC_in.nstride = FC_in->nstride;
  local_190.FC_in.begin.x = (FC_in->begin).x;
  local_190.FC_in.begin.y = (FC_in->begin).y;
  uVar1 = *(undefined8 *)&(FC_in->begin).z;
  uVar6 = (FC_in->end).y;
  local_190.FC_in._52_8_ = *(undefined8 *)&(FC_in->end).z;
  local_190.FC_in.begin.z = (int)uVar1;
  local_190.FC_in.end.x = (int)((ulong)uVar1 >> 0x20);
  local_190.y_vect = y_vect;
  local_190.vect_energy = vect_energy;
  local_190.FCunt = FCunt;
  local_190.ncells = ncells;
  local_190.reactor_type = reactor_type;
  local_190.clean_init_massfrac = clean_init_massfrac;
  local_190.rhoY.end.y = uVar2;
  local_190.temperature.end.y = uVar3;
  local_190.rhoE.end.y = uVar4;
  local_190.frcEExt.end.y = uVar5;
  local_190.FC_in.end.y = uVar6;
  local_190.dt = dt;
  amrex::
  ParallelFor<pele::physics::reactions::utils::FlattenOps<pele::physics::reactions::utils::YCOrder>::unflatten(amrex::Box_const&,int,int,bool,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,double*,double*,long*,double)::_lambda(int,int,int)_1_>
            (box,&local_190);
  return;
}

Assistant:

void unflatten(
    const amrex::Box& box,
    const int ncells,
    const int reactor_type,
    const bool clean_init_massfrac,
    amrex::Array4<amrex::Real> const& rhoY,
    amrex::Array4<amrex::Real> const& temperature,
    amrex::Array4<amrex::Real> const& rhoE,
    amrex::Array4<amrex::Real> const& frcEExt,
    amrex::Array4<amrex::Real> const& FC_in,
    amrex::Real* y_vect,
    amrex::Real* vect_energy,
    long int* FCunt,
    amrex::Real dt)
  {
    BL_PROFILE("Pele::unflatten()");
    const auto len = amrex::length(box);
    const auto lo = amrex::lbound(box);
    amrex::ParallelFor(box, [=] AMREX_GPU_DEVICE(int i, int j, int k) noexcept {
      const int icell =
        (k - lo.z) * len.x * len.y + (j - lo.y) * len.x + (i - lo.x);
      box_unflatten<OrderType>(
        icell, i, j, k, ncells, reactor_type, clean_init_massfrac, rhoY,
        temperature, rhoE, frcEExt, FC_in, y_vect, vect_energy, FCunt[icell],
        dt);
    });
  }